

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImFontPtr_resizeT(ImVector_ImFontPtr *self,int new_size,ImFont *v)

{
  ImFont *local_20;
  ImFont *v_local;
  ImVector_ImFontPtr *pIStack_10;
  int new_size_local;
  ImVector_ImFontPtr *self_local;
  
  local_20 = v;
  v_local._4_4_ = new_size;
  pIStack_10 = self;
  ImVector<ImFont_*>::resize(self,new_size,&local_20);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontPtr_resizeT(ImVector_ImFontPtr* self,int new_size,ImFont* const  v)
{
    return self->resize(new_size,v);
}